

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortDnaSequence.cpp
# Opt level: O2

ShortDnaSequence * __thiscall
ShortDnaSequence::reverseComplement(ShortDnaSequence *__return_storage_ptr__,ShortDnaSequence *this)

{
  string_ptr_t *this_00;
  char cVar1;
  size_type sVar2;
  ShortDnaSequence *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  undefined1 *puVar6;
  char *pcVar7;
  undefined1 uVar8;
  ulong uVar9;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_48;
  ShortDnaSequence *local_38;
  
  this_00 = &this->backward;
  local_38 = __return_storage_ptr__;
  if ((this->backward).px == (element_type *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    sVar2 = ((this->forward).px)->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    std::__cxx11::string::_M_construct((ulong)pbVar4,(char)sVar2);
    boost::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string>
              ((shared_ptr<std::__cxx11::string> *)&sStack_48,pbVar4);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(this_00,&sStack_48);
    boost::detail::shared_count::~shared_count(&sStack_48.pn);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    sVar2 = ((this->forward).px)->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    std::__cxx11::string::_M_construct((ulong)pbVar4,(char)sVar2);
    boost::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string>
              ((shared_ptr<std::__cxx11::string> *)&sStack_48,pbVar4);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->backward_qualities,&sStack_48);
    boost::detail::shared_count::~shared_count(&sStack_48.pn);
    uVar5 = ((this->forward).px)->_M_string_length;
    for (uVar9 = 0; uVar9 < uVar5; uVar9 = uVar9 + 1) {
      puVar6 = (undefined1 *)std::__cxx11::string::at((ulong)(this->forward_qualities).px);
      uVar8 = *puVar6;
      puVar6 = (undefined1 *)std::__cxx11::string::at((ulong)(this->backward_qualities).px);
      *puVar6 = uVar8;
      pcVar7 = (char *)std::__cxx11::string::at((ulong)(this->forward).px);
      cVar1 = *pcVar7;
      if (cVar1 == 'A') {
        uVar8 = 0x54;
LAB_00192501:
        puVar6 = (undefined1 *)std::__cxx11::string::at((ulong)this_00->px);
        *puVar6 = uVar8;
      }
      else {
        if (cVar1 == 'T') {
          uVar8 = 0x41;
          goto LAB_00192501;
        }
        if (cVar1 == 'G') {
          uVar8 = 0x43;
          goto LAB_00192501;
        }
        if (cVar1 == 'N') {
          uVar8 = 0x4e;
          goto LAB_00192501;
        }
        if (cVar1 == 'C') {
          uVar8 = 0x47;
          goto LAB_00192501;
        }
      }
      uVar5 = ((this->forward).px)->_M_string_length;
    }
  }
  pSVar3 = local_38;
  ShortDnaSequence(local_38,this_00,&this->backward_qualities,&this->forward,
                   &this->forward_qualities);
  return pSVar3;
}

Assistant:

ShortDnaSequence ShortDnaSequence::reverseComplement() const {
	// cerr << "ShortDnaSequence::reverseComplement()"  << endl;
	if (backward.get() == 0) {
		backward = string_ptr_t(new string(forward->size(),' '));
		backward_qualities = string_ptr_t(new string(forward->size(),' '));
		int b_pos = forward->size()-1;
		for (size_t i=0; i<forward->size(); ++i, --b_pos) {
			backward_qualities->at(b_pos) = forward_qualities->at(i);
			switch (forward->at(i)) {
			case 'A':
				backward->at(b_pos) = 'T';
				break;
			case 'C':
				backward->at(b_pos) = 'G';
				break;
			case 'G':
				backward->at(b_pos) = 'C';
				break;
			case 'T':
				backward->at(b_pos) = 'A';
				break;
			case 'N':
				backward->at(b_pos) = 'N';
				break;
			default:
				assert(false);
			}
		}
		// cerr << "Computed revcomp: " << *backward << endl;
	}
	return ShortDnaSequence(backward, backward_qualities, forward, forward_qualities);
}